

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QAngle.cpp
# Opt level: O0

void test_qclab_QAngle<double>(void)

{
  QAngle<double> lhs;
  QAngle<double> lhs_00;
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  __type _Var3;
  double dVar4;
  double __x;
  double __x_00;
  double __x_01;
  double dVar5;
  double __x_02;
  double __x_03;
  double __x_04;
  double dVar6;
  double __x_05;
  double __x_06;
  double __x_07;
  double dVar7;
  double __x_08;
  double __x_09;
  double dVar8;
  double __x_10;
  double __x_11;
  double __x_12;
  double __x_13;
  double __x_14;
  double dVar9;
  double __x_15;
  double __x_16;
  double __x_17;
  double __x_18;
  double __x_19;
  double __x_20;
  double __x_21;
  double __x_22;
  double __x_23;
  double __x_24;
  double __x_25;
  AssertHelper local_a48;
  Message local_a40;
  undefined1 local_a38 [8];
  AssertionResult gtest_ar_47;
  Message local_a20;
  undefined1 local_a18 [8];
  AssertionResult gtest_ar_46;
  Message local_a00;
  undefined1 local_9f8 [8];
  AssertionResult gtest_ar_45;
  Message local_9e0;
  undefined1 local_9d8 [8];
  AssertionResult gtest_ar_44;
  Message local_9c0;
  undefined1 local_9b8 [8];
  AssertionResult gtest_ar_43;
  Message local_9a0;
  undefined1 local_998 [8];
  AssertionResult gtest_ar_42;
  double local_980;
  undefined1 local_978 [8];
  QAngle<double> angle2_3;
  QAngle<double> angle1_3;
  double sin_7;
  double cos_7;
  double theta_7;
  Message local_938;
  undefined1 local_930 [8];
  AssertionResult gtest_ar_41;
  Message local_918;
  undefined1 local_910 [8];
  AssertionResult gtest_ar_40;
  Message local_8f8;
  undefined1 local_8f0 [8];
  AssertionResult gtest_ar_39;
  undefined1 local_8d0 [8];
  QAngle<double> minus;
  undefined1 local_8b8 [8];
  undefined1 local_8b0 [8];
  AssertionResult gtest_ar_38;
  Message local_898;
  undefined1 local_890 [8];
  AssertionResult gtest_ar_37;
  Message local_878;
  undefined1 local_870 [8];
  AssertionResult gtest_ar_36;
  double sin_6;
  double cos_6;
  double theta_6;
  undefined1 local_838 [8];
  QAngle<double> sum;
  QAngle<double> angle2_2;
  double sin2_2;
  double cos2_2;
  double theta2_2;
  QAngle<double> angle1_2;
  double sin1_2;
  double cos1_2;
  double theta1_2;
  undefined1 local_7d0 [8];
  undefined1 local_7c8 [8];
  AssertionResult gtest_ar_35;
  Message local_7b0;
  undefined1 local_7a8 [8];
  AssertionResult gtest_ar_34;
  Message local_790;
  undefined1 local_788 [8];
  AssertionResult gtest_ar_33;
  Message local_770;
  undefined1 local_768 [8];
  AssertionResult gtest_ar_32;
  Message local_750;
  undefined1 local_748 [8];
  AssertionResult gtest_ar_31;
  Message local_730;
  undefined1 local_728 [8];
  AssertionResult gtest_ar_30;
  double sin_5;
  double cos_5;
  double theta_5;
  QAngle<double> angle2_1;
  double sin2_1;
  double cos2_1;
  double theta2_1;
  QAngle<double> angle1_1;
  double sin1_1;
  double cos1_1;
  double theta1_1;
  Message local_6a8;
  undefined1 local_6a0 [8];
  AssertionResult gtest_ar_29;
  Message local_688;
  undefined1 local_680 [8];
  AssertionResult gtest_ar_28;
  Message local_668;
  undefined1 local_660 [8];
  AssertionResult gtest_ar_27;
  Message local_648;
  undefined1 local_640 [8];
  AssertionResult gtest_ar_26;
  Message local_628;
  undefined1 local_620 [8];
  AssertionResult gtest_ar_25;
  Message local_608;
  undefined1 local_600 [8];
  AssertionResult gtest_ar_24;
  double sin_4;
  double cos_4;
  double theta_4;
  QAngle<double> angle2;
  double sin2;
  double cos2;
  double theta2;
  QAngle<double> angle1;
  double sin1;
  double cos1;
  double theta1;
  Message local_580;
  undefined1 local_578 [8];
  AssertionResult gtest_ar_23;
  Message local_560;
  double local_558;
  undefined1 local_550 [8];
  AssertionResult gtest_ar_22;
  Message local_538;
  double local_530;
  undefined1 local_528 [8];
  AssertionResult gtest_ar_21;
  QAngle<double> angle_4;
  double sin_3;
  double cos_3;
  double theta_3;
  Message local_4e8;
  undefined1 local_4e0 [8];
  AssertionResult gtest_ar_20;
  Message local_4c8;
  undefined1 local_4c0 [8];
  AssertionResult gtest_ar_19;
  Message local_4a8;
  undefined1 local_4a0 [8];
  AssertionResult gtest_ar_18;
  QAngle<double> angle_3;
  double sin_2;
  double cos_2;
  double theta_2;
  Message local_460;
  undefined1 local_458 [8];
  AssertionResult gtest_ar_17;
  Message local_440;
  undefined1 local_438 [8];
  AssertionResult gtest_ar_16;
  Message local_420;
  undefined1 local_418 [8];
  AssertionResult gtest_ar_15;
  QAngle<double> angle_2;
  double sin_1;
  double cos_1;
  double theta_1;
  Message local_3d8;
  undefined1 local_3d0 [8];
  AssertionResult gtest_ar_14;
  Message local_3b8;
  undefined1 local_3b0 [8];
  AssertionResult gtest_ar_13;
  Message local_398;
  undefined1 local_390 [8];
  AssertionResult gtest_ar_12;
  QAngle<double> angle_1;
  double sin;
  double cos;
  double theta;
  AssertHelper local_338;
  Message local_330;
  bool local_321;
  undefined1 local_320 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_2f0;
  Message local_2e8;
  bool local_2d9;
  undefined1 local_2d8 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_2a8;
  Message local_2a0;
  bool local_291;
  undefined1 local_290 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_260;
  Message local_258;
  bool local_249;
  undefined1 local_248 [8];
  AssertionResult gtest_ar_;
  Message local_230;
  undefined1 local_228 [8];
  AssertionResult gtest_ar_11;
  Message local_210;
  double local_208;
  double local_200;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar_10;
  Message local_1e0;
  double local_1d8;
  double local_1d0;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar_9;
  Message local_1b0;
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar_8;
  Message local_190;
  double local_188;
  double local_180;
  undefined1 local_178 [8];
  AssertionResult gtest_ar_7;
  Message local_160;
  double local_158;
  double local_150;
  undefined1 local_148 [8];
  AssertionResult gtest_ar_6;
  Message local_130;
  undefined1 local_128 [8];
  AssertionResult gtest_ar_5;
  Message local_110;
  undefined1 local_108 [8];
  AssertionResult gtest_ar_4;
  Message local_f0;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar_3;
  QAngle<double> new_angle;
  Message local_c0;
  int local_b4;
  double local_b0;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar_2;
  Message local_90;
  int local_84;
  double local_80;
  undefined1 local_78 [8];
  AssertionResult gtest_ar_1;
  Message local_50;
  int local_44;
  double local_40;
  undefined1 local_38 [8];
  AssertionResult gtest_ar;
  QAngle<double> angle;
  double tol;
  double pi;
  
  _Var3 = std::atan<int>(1);
  dVar4 = _Var3 * 4.0;
  std::numeric_limits<double>::epsilon();
  qclab::QAngle<double>::QAngle((QAngle<double> *)&gtest_ar.message_);
  local_40 = qclab::QAngle<double>::cos((QAngle<double> *)&gtest_ar.message_,__x);
  local_44 = 1;
  testing::internal::EqHelper::Compare<double,_int,_nullptr>
            ((EqHelper *)local_38,"angle.cos()","1",&local_40,&local_44);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message(&local_50);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_38);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0xd,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  local_80 = qclab::QAngle<double>::sin((QAngle<double> *)&gtest_ar.message_,__x_00);
  local_84 = 0;
  testing::internal::EqHelper::Compare<double,_int,_nullptr>
            ((EqHelper *)local_78,"angle.sin()","0",&local_80,&local_84);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(&local_90);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_78);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0xe,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  local_b0 = qclab::QAngle<double>::theta((QAngle<double> *)&gtest_ar.message_);
  local_b4 = 0;
  testing::internal::EqHelper::Compare<double,_int,_nullptr>
            ((EqHelper *)local_a8,"angle.theta()","0",&local_b0,&local_b4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&new_angle.sin_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0xf,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&new_angle.sin_,&local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&new_angle.sin_);
    testing::Message::~Message(&local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  qclab::QAngle<double>::QAngle((QAngle<double> *)&gtest_ar_3.message_,1.0);
  qclab::QAngle<double>::update
            ((QAngle<double> *)&gtest_ar.message_,(QAngle<double> *)&gtest_ar_3.message_);
  dVar5 = qclab::QAngle<double>::cos((QAngle<double> *)&gtest_ar.message_,__x_01);
  _Var3 = std::cos<int>(1);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_e8,"angle.cos()","std::cos( 1 )","tol",dVar5,_Var3,
             2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
  if (!bVar1) {
    testing::Message::Message(&local_f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x14,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
  dVar5 = qclab::QAngle<double>::sin((QAngle<double> *)&gtest_ar.message_,__x_02);
  _Var3 = std::sin<int>(1);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_108,"angle.sin()","std::sin( 1 )","tol",dVar5,_Var3,
             2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar1) {
    testing::Message::Message(&local_110);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x15,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_110);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  dVar5 = qclab::QAngle<double>::theta((QAngle<double> *)&gtest_ar.message_);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_128,"angle.theta()","1","tol",dVar5,1.0,2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
  if (!bVar1) {
    testing::Message::Message(&local_130);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_128);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x16,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_130);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
  qclab::QAngle<double>::update((QAngle<double> *)&gtest_ar.message_,dVar4 / 2.0);
  local_150 = qclab::QAngle<double>::cos((QAngle<double> *)&gtest_ar.message_,__x_03);
  local_158 = ::cos(dVar4 / 2.0);
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_148,"angle.cos()","std::cos( pi/2 )",&local_150,&local_158);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
  if (!bVar1) {
    testing::Message::Message(&local_160);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x1a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_160);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_160);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
  local_180 = qclab::QAngle<double>::sin((QAngle<double> *)&gtest_ar.message_,__x_04);
  local_188 = ::sin(dVar4 / 2.0);
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_178,"angle.sin()","std::sin( pi/2 )",&local_180,&local_188);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_178);
  if (!bVar1) {
    testing::Message::Message(&local_190);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_178);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x1b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_190);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_190);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_178);
  dVar5 = qclab::QAngle<double>::theta((QAngle<double> *)&gtest_ar.message_);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_1a8,"angle.theta()","pi/2","tol",dVar5,dVar4 / 2.0,
             2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
  if (!bVar1) {
    testing::Message::Message(&local_1b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x1c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_1b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_1b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
  dVar5 = ::cos(dVar4 / 3.0);
  dVar6 = ::sin(dVar4 / 3.0);
  qclab::QAngle<double>::update((QAngle<double> *)&gtest_ar.message_,dVar5,dVar6);
  local_1d0 = qclab::QAngle<double>::cos((QAngle<double> *)&gtest_ar.message_,__x_05);
  local_1d8 = ::cos(dVar4 / 3.0);
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_1c8,"angle.cos()","std::cos( pi/3 )",&local_1d0,&local_1d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
  if (!bVar1) {
    testing::Message::Message(&local_1e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x20,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_1e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_1e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
  local_200 = qclab::QAngle<double>::sin((QAngle<double> *)&gtest_ar.message_,__x_06);
  local_208 = ::sin(dVar4 / 3.0);
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_1f8,"angle.sin()","std::sin( pi/3 )",&local_200,&local_208);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
  if (!bVar1) {
    testing::Message::Message(&local_210);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x21,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_210);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
  dVar5 = qclab::QAngle<double>::theta((QAngle<double> *)&gtest_ar.message_);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_228,"angle.theta()","pi/3","tol",dVar5,dVar4 / 3.0,
             2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_228);
  if (!bVar1) {
    testing::Message::Message(&local_230);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_228);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x22,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_230);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_230);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_228);
  local_249 = qclab::QAngle<double>::operator!=
                        ((QAngle<double> *)&gtest_ar.message_,(QAngle<double> *)&gtest_ar_3.message_
                        );
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_248,&local_249,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_248);
  if (!bVar1) {
    testing::Message::Message(&local_258);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_248,
               (AssertionResult *)"angle != new_angle","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_260,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x25,pcVar2);
    testing::internal::AssertHelper::operator=(&local_260,&local_258);
    testing::internal::AssertHelper::~AssertHelper(&local_260);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_258);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_248);
  bVar1 = qclab::QAngle<double>::operator==
                    ((QAngle<double> *)&gtest_ar.message_,(QAngle<double> *)&gtest_ar_3.message_);
  local_291 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_290,&local_291,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_290);
  if (!bVar1) {
    testing::Message::Message(&local_2a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_290,
               (AssertionResult *)"angle == new_angle","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x26,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2a8,&local_2a0);
    testing::internal::AssertHelper::~AssertHelper(&local_2a8);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_2a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_290);
  qclab::QAngle<double>::update
            ((QAngle<double> *)&gtest_ar_3.message_,(QAngle<double> *)&gtest_ar.message_);
  local_2d9 = qclab::QAngle<double>::operator==
                        ((QAngle<double> *)&gtest_ar.message_,(QAngle<double> *)&gtest_ar_3.message_
                        );
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2d8,&local_2d9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d8);
  if (!bVar1) {
    testing::Message::Message(&local_2e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_2d8,
               (AssertionResult *)"angle == new_angle","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x28,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2f0,&local_2e8);
    testing::internal::AssertHelper::~AssertHelper(&local_2f0);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_2e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d8);
  bVar1 = qclab::QAngle<double>::operator!=
                    ((QAngle<double> *)&gtest_ar.message_,(QAngle<double> *)&gtest_ar_3.message_);
  local_321 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_320,&local_321,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_320);
  if (!bVar1) {
    testing::Message::Message(&local_330);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&theta,(internal *)local_320,(AssertionResult *)"angle != new_angle","true"
               ,"false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x29,pcVar2);
    testing::internal::AssertHelper::operator=(&local_338,&local_330);
    testing::internal::AssertHelper::~AssertHelper(&local_338);
    std::__cxx11::string::~string((string *)&theta);
    testing::Message::~Message(&local_330);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_320);
  dVar5 = ::cos(1.0);
  dVar6 = ::sin(1.0);
  qclab::QAngle<double>::QAngle((QAngle<double> *)&gtest_ar_12.message_,1.0);
  dVar7 = qclab::QAngle<double>::cos((QAngle<double> *)&gtest_ar_12.message_,__x_07);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_390,"angle.cos()","cos","tol",dVar7,dVar5,2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_390);
  if (!bVar1) {
    testing::Message::Message(&local_398);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_390);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x32,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_398);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_398);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_390);
  dVar5 = qclab::QAngle<double>::sin((QAngle<double> *)&gtest_ar_12.message_,__x_08);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_3b0,"angle.sin()","sin","tol",dVar5,dVar6,2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b0);
  if (!bVar1) {
    testing::Message::Message(&local_3b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x33,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_3b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_3b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b0);
  dVar5 = qclab::QAngle<double>::theta((QAngle<double> *)&gtest_ar_12.message_);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_3d0,"angle.theta()","theta","tol",dVar5,1.0,2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d0);
  if (!bVar1) {
    testing::Message::Message(&local_3d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&theta_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x34,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&theta_1,&local_3d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&theta_1);
    testing::Message::~Message(&local_3d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d0);
  dVar5 = dVar4 / 2.0;
  dVar6 = ::cos(dVar5);
  dVar7 = ::sin(dVar5);
  qclab::QAngle<double>::QAngle((QAngle<double> *)&gtest_ar_15.message_,dVar5);
  dVar8 = qclab::QAngle<double>::cos((QAngle<double> *)&gtest_ar_15.message_,__x_09);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_418,"angle.cos()","cos","tol",dVar8,dVar6,2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_418);
  if (!bVar1) {
    testing::Message::Message(&local_420);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_418);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x3d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,&local_420);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(&local_420);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_418);
  dVar6 = qclab::QAngle<double>::sin((QAngle<double> *)&gtest_ar_15.message_,__x_10);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_438,"angle.sin()","sin","tol",dVar6,dVar7,2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_438);
  if (!bVar1) {
    testing::Message::Message(&local_440);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_438);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x3e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,&local_440);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(&local_440);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_438);
  dVar6 = qclab::QAngle<double>::theta((QAngle<double> *)&gtest_ar_15.message_);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_458,"angle.theta()","theta","tol",dVar6,dVar5,2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_458);
  if (!bVar1) {
    testing::Message::Message(&local_460);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_458);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&theta_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x3f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&theta_2,&local_460);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&theta_2);
    testing::Message::~Message(&local_460);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_458);
  dVar5 = ::cos(0.5);
  dVar6 = ::sin(0.5);
  qclab::QAngle<double>::QAngle((QAngle<double> *)&gtest_ar_18.message_,dVar5,dVar6);
  dVar7 = qclab::QAngle<double>::cos((QAngle<double> *)&gtest_ar_18.message_,__x_11);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_4a0,"angle.cos()","cos","tol",dVar7,dVar5,2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4a0);
  if (!bVar1) {
    testing::Message::Message(&local_4a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x48,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,&local_4a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
    testing::Message::~Message(&local_4a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4a0);
  dVar5 = qclab::QAngle<double>::sin((QAngle<double> *)&gtest_ar_18.message_,__x_12);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_4c0,"angle.sin()","sin","tol",dVar5,dVar6,2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4c0);
  if (!bVar1) {
    testing::Message::Message(&local_4c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_20.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x49,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20.message_,&local_4c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20.message_);
    testing::Message::~Message(&local_4c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4c0);
  dVar5 = qclab::QAngle<double>::theta((QAngle<double> *)&gtest_ar_18.message_);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_4e0,"angle.theta()","theta","tol",dVar5,0.5,2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4e0);
  if (!bVar1) {
    testing::Message::Message(&local_4e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&theta_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x4a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&theta_3,&local_4e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&theta_3);
    testing::Message::~Message(&local_4e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4e0);
  cos_3 = dVar4 / 4.0;
  sin_3 = ::cos(cos_3);
  angle_4.sin_ = ::sin(cos_3);
  qclab::QAngle<double>::QAngle((QAngle<double> *)&gtest_ar_21.message_,sin_3,angle_4.sin_);
  local_530 = qclab::QAngle<double>::cos((QAngle<double> *)&gtest_ar_21.message_,__x_13);
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_528,"angle.cos()","cos",&local_530,&sin_3);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_528);
  if (!bVar1) {
    testing::Message::Message(&local_538);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_528);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x53,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_22.message_,&local_538);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22.message_);
    testing::Message::~Message(&local_538);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_528);
  local_558 = qclab::QAngle<double>::sin((QAngle<double> *)&gtest_ar_21.message_,__x_14);
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_550,"angle.sin()","sin",&local_558,&angle_4.sin_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_550);
  if (!bVar1) {
    testing::Message::Message(&local_560);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_550);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_23.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x54,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_23.message_,&local_560);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_23.message_);
    testing::Message::~Message(&local_560);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_550);
  dVar5 = qclab::QAngle<double>::theta((QAngle<double> *)&gtest_ar_21.message_);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_578,"angle.theta()","theta","tol",dVar5,cos_3,2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_578);
  if (!bVar1) {
    testing::Message::Message(&local_580);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_578);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&theta1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x55,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&theta1,&local_580);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&theta1);
    testing::Message::~Message(&local_580);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_578);
  dVar7 = dVar4 / 2.0;
  ::cos(dVar7);
  angle1.sin_ = ::sin(dVar7);
  qclab::QAngle<double>::QAngle((QAngle<double> *)&theta2,dVar7);
  dVar5 = dVar4 / 3.0;
  dVar6 = ::cos(dVar5);
  angle2.sin_ = ::sin(dVar5);
  qclab::QAngle<double>::QAngle((QAngle<double> *)&theta_4,dVar5);
  qclab::QAngle<double>::operator+=((QAngle<double> *)&theta2,(QAngle<double> *)&theta_4);
  dVar7 = dVar7 + dVar5;
  dVar8 = ::cos(dVar7);
  gtest_ar_24.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )::sin(dVar7);
  dVar9 = qclab::QAngle<double>::cos
                    ((QAngle<double> *)&theta2,
                     (double)gtest_ar_24.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_600,"angle1.cos()","cos","tol",dVar9,dVar8,2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_600);
  if (!bVar1) {
    testing::Message::Message(&local_608);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_600);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_25.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x68,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_25.message_,&local_608);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_25.message_);
    testing::Message::~Message(&local_608);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_600);
  dVar8 = qclab::QAngle<double>::sin((QAngle<double> *)&theta2,__x_15);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_620,"angle1.sin()","sin","tol",dVar8,
             (double)gtest_ar_24.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl,2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_620);
  if (!bVar1) {
    testing::Message::Message(&local_628);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_620);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_26.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x69,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_26.message_,&local_628);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_26.message_);
    testing::Message::~Message(&local_628);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_620);
  dVar8 = qclab::QAngle<double>::theta((QAngle<double> *)&theta2);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_640,"angle1.theta()","theta","tol",dVar8,dVar7,2.220446049250313e-15)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_640);
  if (!bVar1) {
    testing::Message::Message(&local_648);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_640);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_27.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x6a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_27.message_,&local_648);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_27.message_);
    testing::Message::~Message(&local_648);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_640);
  dVar7 = qclab::QAngle<double>::cos((QAngle<double> *)&theta_4,__x_16);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_660,"angle2.cos()","cos2","tol",dVar7,dVar6,2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_660);
  if (!bVar1) {
    testing::Message::Message(&local_668);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_660);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_28.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x6b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_28.message_,&local_668);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_28.message_);
    testing::Message::~Message(&local_668);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_660);
  dVar6 = qclab::QAngle<double>::sin((QAngle<double> *)&theta_4,__x_17);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_680,"angle2.sin()","sin2","tol",dVar6,angle2.sin_,
             2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_680);
  if (!bVar1) {
    testing::Message::Message(&local_688);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_680);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_29.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x6c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_29.message_,&local_688);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_29.message_);
    testing::Message::~Message(&local_688);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_680);
  dVar6 = qclab::QAngle<double>::theta((QAngle<double> *)&theta_4);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_6a0,"angle2.theta()","theta2","tol",dVar6,dVar5,2.220446049250313e-15
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6a0);
  if (!bVar1) {
    testing::Message::Message(&local_6a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_6a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&theta1_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x6d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&theta1_1,&local_6a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&theta1_1);
    testing::Message::~Message(&local_6a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6a0);
  dVar7 = dVar4 / 2.0;
  ::cos(dVar7);
  angle1_1.sin_ = ::sin(dVar7);
  qclab::QAngle<double>::QAngle((QAngle<double> *)&theta2_1,dVar7);
  dVar5 = dVar4 / 3.0;
  dVar6 = ::cos(dVar5);
  angle2_1.sin_ = ::sin(dVar5);
  qclab::QAngle<double>::QAngle((QAngle<double> *)&theta_5,dVar5);
  qclab::QAngle<double>::operator-=((QAngle<double> *)&theta2_1,(QAngle<double> *)&theta_5);
  dVar7 = dVar7 - dVar5;
  dVar8 = ::cos(dVar7);
  gtest_ar_30.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )::sin(dVar7);
  dVar9 = qclab::QAngle<double>::cos
                    ((QAngle<double> *)&theta2_1,
                     (double)gtest_ar_30.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_728,"angle1.cos()","cos","tol",dVar9,dVar8,2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_728);
  if (!bVar1) {
    testing::Message::Message(&local_730);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_728);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_31.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x80,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_31.message_,&local_730);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_31.message_);
    testing::Message::~Message(&local_730);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_728);
  dVar8 = qclab::QAngle<double>::sin((QAngle<double> *)&theta2_1,__x_18);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_748,"angle1.sin()","sin","tol",dVar8,
             (double)gtest_ar_30.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl,2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_748);
  if (!bVar1) {
    testing::Message::Message(&local_750);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_748);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_32.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x81,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_32.message_,&local_750);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_32.message_);
    testing::Message::~Message(&local_750);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_748);
  dVar8 = qclab::QAngle<double>::theta((QAngle<double> *)&theta2_1);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_768,"angle1.theta()","theta","tol",dVar8,dVar7,2.220446049250313e-15)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_768);
  if (!bVar1) {
    testing::Message::Message(&local_770);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_768);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_33.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x82,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_33.message_,&local_770);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_33.message_);
    testing::Message::~Message(&local_770);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_768);
  dVar7 = qclab::QAngle<double>::cos((QAngle<double> *)&theta_5,__x_19);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_788,"angle2.cos()","cos2","tol",dVar7,dVar6,2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_788);
  if (!bVar1) {
    testing::Message::Message(&local_790);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_788);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_34.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x83,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_34.message_,&local_790);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_34.message_);
    testing::Message::~Message(&local_790);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_788);
  dVar6 = qclab::QAngle<double>::sin((QAngle<double> *)&theta_5,__x_20);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_7a8,"angle2.sin()","sin2","tol",dVar6,angle2_1.sin_,
             2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7a8);
  if (!bVar1) {
    testing::Message::Message(&local_7b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_7a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_35.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x84,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_35.message_,&local_7b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_35.message_);
    testing::Message::~Message(&local_7b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7a8);
  dVar6 = qclab::QAngle<double>::theta((QAngle<double> *)&theta_5);
  pcVar2 = "angle2.theta()";
  testing::internal::DoubleNearPredFormat
            ((internal *)local_7c8,"angle2.theta()","theta2","tol",dVar6,dVar5,2.220446049250313e-15
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7c8);
  if (!bVar1) {
    testing::Message::Message((Message *)local_7d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_7c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&theta1_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x85,pcVar2);
    pcVar2 = local_7d0;
    testing::internal::AssertHelper::operator=((AssertHelper *)&theta1_2,(Message *)pcVar2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&theta1_2);
    testing::Message::~Message((Message *)local_7d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7c8);
  dVar8 = dVar4 / 2.0;
  ::cos(dVar8);
  angle1_2.sin_ = ::sin(dVar8);
  qclab::QAngle<double>::QAngle((QAngle<double> *)&theta2_2,dVar8);
  dVar4 = dVar4 / 3.0;
  ::cos(dVar4);
  ::sin(dVar4);
  qclab::QAngle<double>::QAngle((QAngle<double> *)&sum.sin_,dVar4);
  lhs_00.sin_ = angle1_2.cos_;
  lhs_00.cos_ = theta2_2;
  _local_838 = qclab::operator+((qclab *)&sum.sin_,lhs_00,(QAngle<double> *)pcVar2);
  dVar5 = dVar8 + dVar4;
  dVar6 = ::cos(dVar5);
  gtest_ar_36.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )::sin(dVar5);
  dVar7 = qclab::QAngle<double>::cos
                    ((QAngle<double> *)local_838,
                     (double)gtest_ar_36.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_870,"sum.cos()","cos","tol",dVar7,dVar6,2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_870);
  if (!bVar1) {
    testing::Message::Message(&local_878);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_870);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_37.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x98,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_37.message_,&local_878);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_37.message_);
    testing::Message::~Message(&local_878);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_870);
  dVar6 = qclab::QAngle<double>::sin((QAngle<double> *)local_838,__x_21);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_890,"sum.sin()","sin","tol",dVar6,
             (double)gtest_ar_36.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl,2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_890);
  if (!bVar1) {
    testing::Message::Message(&local_898);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_890);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_38.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x99,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_38.message_,&local_898);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_38.message_);
    testing::Message::~Message(&local_898);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_890);
  dVar6 = qclab::QAngle<double>::theta((QAngle<double> *)local_838);
  pcVar2 = "sum.theta()";
  testing::internal::DoubleNearPredFormat
            ((internal *)local_8b0,"sum.theta()","theta","tol",dVar6,dVar5,2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8b0);
  if (!bVar1) {
    testing::Message::Message((Message *)local_8b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_8b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&minus.sin_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x9a,pcVar2);
    pcVar2 = local_8b8;
    testing::internal::AssertHelper::operator=((AssertHelper *)&minus.sin_,(Message *)pcVar2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&minus.sin_);
    testing::Message::~Message((Message *)local_8b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8b0);
  gtest_ar_39.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )theta2_2;
  lhs.sin_ = angle1_2.cos_;
  lhs.cos_ = theta2_2;
  _local_8d0 = qclab::operator-((qclab *)&sum.sin_,lhs,(QAngle<double> *)pcVar2);
  dVar8 = dVar8 - dVar4;
  dVar4 = ::cos(dVar8);
  gtest_ar_36.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )::sin(dVar8);
  dVar5 = qclab::QAngle<double>::cos
                    ((QAngle<double> *)local_8d0,
                     (double)gtest_ar_36.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_8f0,"minus.cos()","cos","tol",dVar5,dVar4,2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8f0);
  if (!bVar1) {
    testing::Message::Message(&local_8f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_8f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_40.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0xa1,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_40.message_,&local_8f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_40.message_);
    testing::Message::~Message(&local_8f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8f0);
  dVar4 = qclab::QAngle<double>::sin((QAngle<double> *)local_8d0,__x_22);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_910,"minus.sin()","sin","tol",dVar4,
             (double)gtest_ar_36.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl,2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_910);
  if (!bVar1) {
    testing::Message::Message(&local_918);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_910);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_41.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0xa2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_41.message_,&local_918);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_41.message_);
    testing::Message::~Message(&local_918);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_910);
  dVar4 = qclab::QAngle<double>::theta((QAngle<double> *)local_8d0);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_930,"minus.theta()","theta","tol",dVar4,dVar8,2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_930);
  if (!bVar1) {
    testing::Message::Message(&local_938);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_930);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&theta_7,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0xa3,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&theta_7,&local_938);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&theta_7);
    testing::Message::~Message(&local_938);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_930);
  dVar4 = ::cos(1.0);
  dVar5 = ::sin(1.0);
  qclab::QAngle<double>::QAngle((QAngle<double> *)&angle2_3.sin_,1.0);
  qclab::QAngle<double>::QAngle((QAngle<double> *)local_978);
  join_0x00001240_0x00001200_ = qclab::QAngle<double>::operator-((QAngle<double> *)&angle2_3.sin_);
  local_978 = (undefined1  [8])
              gtest_ar_42.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl;
  angle2_3.cos_ = local_980;
  dVar6 = qclab::QAngle<double>::cos((QAngle<double> *)&angle2_3.sin_,(double)local_978);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_998,"angle1.cos()","cos","tol",dVar6,dVar4,2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_998);
  if (!bVar1) {
    testing::Message::Message(&local_9a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_998);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_43.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0xaf,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_43.message_,&local_9a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_43.message_);
    testing::Message::~Message(&local_9a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_998);
  dVar6 = qclab::QAngle<double>::sin((QAngle<double> *)&angle2_3.sin_,__x_23);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_9b8,"angle1.sin()","sin","tol",dVar6,dVar5,2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9b8);
  if (!bVar1) {
    testing::Message::Message(&local_9c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_9b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_44.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0xb0,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_44.message_,&local_9c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_44.message_);
    testing::Message::~Message(&local_9c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9b8);
  dVar6 = qclab::QAngle<double>::theta((QAngle<double> *)&angle2_3.sin_);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_9d8,"angle1.theta()","theta","tol",dVar6,1.0,2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9d8);
  if (!bVar1) {
    testing::Message::Message(&local_9e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_9d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_45.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0xb1,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_45.message_,&local_9e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_45.message_);
    testing::Message::~Message(&local_9e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9d8);
  dVar6 = qclab::QAngle<double>::cos((QAngle<double> *)local_978,__x_24);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_9f8,"angle2.cos()","cos","tol",dVar6,dVar4,2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9f8);
  if (!bVar1) {
    testing::Message::Message(&local_a00);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_9f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_46.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0xb2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_46.message_,&local_a00);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_46.message_);
    testing::Message::~Message(&local_a00);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9f8);
  dVar4 = qclab::QAngle<double>::sin((QAngle<double> *)local_978,__x_25);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_a18,"angle2.sin()","-sin","tol",dVar4,-dVar5,2.220446049250313e-15);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a18);
  if (!bVar1) {
    testing::Message::Message(&local_a20);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a18);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_47.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0xb3,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_47.message_,&local_a20);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_47.message_);
    testing::Message::~Message(&local_a20);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a18);
  dVar4 = qclab::QAngle<double>::theta((QAngle<double> *)local_978);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_a38,"angle2.theta()","-theta","tol",dVar4,-1.0,2.220446049250313e-15)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a38);
  if (!bVar1) {
    testing::Message::Message(&local_a40);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a38);
    testing::internal::AssertHelper::AssertHelper
              (&local_a48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0xb4,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a48,&local_a40);
    testing::internal::AssertHelper::~AssertHelper(&local_a48);
    testing::Message::~Message(&local_a40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a38);
  return;
}

Assistant:

void test_qclab_QAngle() {

  const T pi = 4 * std::atan(1) ;
  const T tol = 10 * std::numeric_limits< T >::epsilon() ;

  {
    qclab::QAngle< T >  angle ;

    EXPECT_EQ( angle.cos() , 1 ) ;    // cos
    EXPECT_EQ( angle.sin() , 0 ) ;    // sin
    EXPECT_EQ( angle.theta() , 0 ) ;  // theta

    // update(angle)
    qclab::QAngle< T >  new_angle( 1 ) ;
    angle.update( new_angle ) ;
    EXPECT_NEAR( angle.cos() , std::cos( 1 ) , tol ) ;
    EXPECT_NEAR( angle.sin() , std::sin( 1 ) , tol ) ;
    EXPECT_NEAR( angle.theta() , 1 , tol ) ;

    // update(theta)
    angle.update( pi/2 ) ;
    EXPECT_EQ( angle.cos() , std::cos( pi/2 ) ) ;
    EXPECT_EQ( angle.sin() , std::sin( pi/2 ) ) ;
    EXPECT_NEAR( angle.theta() , pi/2 , tol ) ;

    // update(cos,sin)
    angle.update( std::cos( pi/3 ) , std::sin( pi/3 ) ) ;
    EXPECT_EQ( angle.cos() , std::cos( pi/3 ) ) ;
    EXPECT_EQ( angle.sin() , std::sin( pi/3 ) ) ;
    EXPECT_NEAR( angle.theta() , pi/3 , tol ) ;

    // operators == and !=
    EXPECT_TRUE( angle != new_angle ) ;
    EXPECT_FALSE( angle == new_angle ) ;
    new_angle.update( angle ) ;
    EXPECT_TRUE( angle == new_angle ) ;
    EXPECT_FALSE( angle != new_angle ) ;
  }

  {
    const T theta = 1 ;
    const T cos = std::cos( theta ) ;
    const T sin = std::sin( theta ) ;
    qclab::QAngle< T >  angle( theta ) ;

    EXPECT_NEAR( angle.cos() , cos , tol ) ;      // cos
    EXPECT_NEAR( angle.sin() , sin , tol ) ;      // sin
    EXPECT_NEAR( angle.theta() , theta , tol ) ;  // theta
  }

  {
    const T theta = pi/2 ;
    const T cos = std::cos( theta ) ;
    const T sin = std::sin( theta ) ;
    qclab::QAngle< T >  angle( theta ) ;

    EXPECT_NEAR( angle.cos() , cos , tol ) ;      // cos
    EXPECT_NEAR( angle.sin() , sin , tol ) ;      // sin
    EXPECT_NEAR( angle.theta() , theta , tol ) ;  // theta
  }

  {
    const T theta = 0.5 ;
    const T cos = std::cos( theta ) ;
    const T sin = std::sin( theta ) ;
    qclab::QAngle< T >  angle( cos , sin ) ;

    EXPECT_NEAR( angle.cos() , cos , tol ) ;      // cos
    EXPECT_NEAR( angle.sin() , sin , tol ) ;      // sin
    EXPECT_NEAR( angle.theta() , theta , tol ) ;  // theta
  }

  {
    const T theta = pi/4 ;
    const T cos = std::cos( theta ) ;
    const T sin = std::sin( theta ) ;
    qclab::QAngle< T >  angle( cos , sin ) ;

    EXPECT_EQ( angle.cos() , cos ) ;              // cos
    EXPECT_EQ( angle.sin() , sin ) ;              // sin
    EXPECT_NEAR( angle.theta() , theta , tol ) ;  // theta
  }

  {
    const T theta1 = pi/2 ;
    const T cos1 = std::cos( theta1 ) ;
    const T sin1 = std::sin( theta1 ) ;
    qclab::QAngle< T >  angle1( theta1 ) ;

    const T theta2 = pi/3 ;
    const T cos2 = std::cos( theta2 ) ;
    const T sin2 = std::sin( theta2 ) ;
    qclab::QAngle< T >  angle2( theta2 ) ;

    // operator +=
    angle1 += angle2 ;
    T theta = theta1 + theta2 ;
    T cos = std::cos( theta ) ;
    T sin = std::sin( theta ) ;
    EXPECT_NEAR( angle1.cos() , cos , tol ) ;       // cos
    EXPECT_NEAR( angle1.sin() , sin , tol ) ;       // sin
    EXPECT_NEAR( angle1.theta() , theta , tol ) ;   // theta
    EXPECT_NEAR( angle2.cos() , cos2 , tol ) ;      // cos
    EXPECT_NEAR( angle2.sin() , sin2 , tol ) ;      // sin
    EXPECT_NEAR( angle2.theta() , theta2 , tol ) ;  // theta
  }

  {
    const T theta1 = pi/2 ;
    const T cos1 = std::cos( theta1 ) ;
    const T sin1 = std::sin( theta1 ) ;
    qclab::QAngle< T >  angle1( theta1 ) ;

    const T theta2 = pi/3 ;
    const T cos2 = std::cos( theta2 ) ;
    const T sin2 = std::sin( theta2 ) ;
    qclab::QAngle< T >  angle2( theta2 ) ;

    // operator -=
    angle1 -= angle2 ;
    T theta = theta1 - theta2 ;
    T cos = std::cos( theta ) ;
    T sin = std::sin( theta ) ;
    EXPECT_NEAR( angle1.cos() , cos , tol ) ;       // cos
    EXPECT_NEAR( angle1.sin() , sin , tol ) ;       // sin
    EXPECT_NEAR( angle1.theta() , theta , tol ) ;   // theta
    EXPECT_NEAR( angle2.cos() , cos2 , tol ) ;      // cos
    EXPECT_NEAR( angle2.sin() , sin2 , tol ) ;      // sin
    EXPECT_NEAR( angle2.theta() , theta2 , tol ) ;  // theta
  }

  {
    const T theta1 = pi/2 ;
    const T cos1 = std::cos( theta1 ) ;
    const T sin1 = std::sin( theta1 ) ;
    qclab::QAngle< T >  angle1( theta1 ) ;

    const T theta2 = pi/3 ;
    const T cos2 = std::cos( theta2 ) ;
    const T sin2 = std::sin( theta2 ) ;
    qclab::QAngle< T >  angle2( theta2 ) ;

    // operator +
    qclab::QAngle< T > sum = angle1 + angle2 ;
    T theta = theta1 + theta2 ;
    T cos = std::cos( theta ) ;
    T sin = std::sin( theta ) ;
    EXPECT_NEAR( sum.cos() , cos , tol ) ;      // cos
    EXPECT_NEAR( sum.sin() , sin , tol ) ;      // sin
    EXPECT_NEAR( sum.theta() , theta , tol ) ;  // theta

    // operator -
    qclab::QAngle< T > minus = angle1 - angle2 ;
    theta = theta1 - theta2 ;
    cos = std::cos( theta ) ;
    sin = std::sin( theta ) ;
    EXPECT_NEAR( minus.cos() , cos , tol ) ;      // cos
    EXPECT_NEAR( minus.sin() , sin , tol ) ;      // sin
    EXPECT_NEAR( minus.theta() , theta , tol ) ;  // theta
  }

  {
    const T theta = 1 ;
    const T cos = std::cos( theta ) ;
    const T sin = std::sin( theta ) ;
    qclab::QAngle< T >  angle1( theta ) ;
    qclab::QAngle< T >  angle2 ;

    // operator -
    angle2 = -angle1 ;
    EXPECT_NEAR( angle1.cos() ,  cos , tol ) ;      // cos
    EXPECT_NEAR( angle1.sin() , sin , tol ) ;       // sin
    EXPECT_NEAR( angle1.theta() , theta , tol ) ;   // theta
    EXPECT_NEAR( angle2.cos() ,  cos , tol ) ;      // cos
    EXPECT_NEAR( angle2.sin() , -sin , tol ) ;      // sin
    EXPECT_NEAR( angle2.theta() , -theta , tol ) ;  // theta
  }

}